

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlStringDecodeEntities(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *str_00;
  PyObject *pPVar2;
  Py_ssize_t PVar3;
  xmlChar end3;
  xmlChar end2;
  xmlChar end;
  int what;
  xmlChar *str;
  PyObject *pyobj_ctxt;
  
  iVar1 = libxml_deprecationWarning("xmlStringDecodeEntities");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT
                      (args,"Oziccc:xmlStringDecodeEntities",&pyobj_ctxt,&str,&what,&end,&end2,&end3
                      );
    if (iVar1 != 0) {
      if (pyobj_ctxt == (PyObject *)&_Py_NoneStruct) {
        PVar3 = 0;
      }
      else {
        PVar3 = pyobj_ctxt[1].ob_refcnt;
      }
      str_00 = (xmlChar *)xmlStringDecodeEntities(PVar3,str,what,end,end2,end3);
      pPVar2 = libxml_xmlCharPtrWrap(str_00);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlStringDecodeEntities(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlChar * c_retval;
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlChar * str;
    int what;
    xmlChar end;
    xmlChar end2;
    xmlChar end3;

    if (libxml_deprecationWarning("xmlStringDecodeEntities") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"Oziccc:xmlStringDecodeEntities", &pyobj_ctxt, &str, &what, &end, &end2, &end3))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    c_retval = xmlStringDecodeEntities(ctxt, str, what, end, end2, end3);
    py_retval = libxml_xmlCharPtrWrap((xmlChar *) c_retval);
    return(py_retval);
}